

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

QFuture<void> QtFuture::makeReadyVoidFuture(void)

{
  long lVar1;
  QFutureInterfaceBasePrivate *extraout_RDX;
  _func_int **in_RDI;
  long in_FS_OFFSET;
  QFuture<void> QVar2;
  QFutureInterface<void> promise;
  undefined4 in_stack_ffffffffffffffa8;
  State in_stack_ffffffffffffffac;
  QFutureInterface<void> *in_stack_ffffffffffffffb0;
  QFutureInterfaceBase *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFutureInterface<void>::QFutureInterface(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QFutureInterfaceBase::reportStarted(in_stack_ffffffffffffffd0);
  QFutureInterface<void>::reportFinished(in_stack_ffffffffffffffb0);
  QFutureInterface<void>::future
            ((QFutureInterface<void> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            );
  QFutureInterface<void>::~QFutureInterface((QFutureInterface<void> *)0x6e10a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2.d.d = extraout_RDX;
    QVar2.d._vptr_QFutureInterfaceBase = in_RDI;
    return (QFuture<void>)QVar2.d;
  }
  __stack_chk_fail();
}

Assistant:

QFuture<void> makeReadyVoidFuture()
{
    QFutureInterface<void> promise;
    promise.reportStarted();
    promise.reportFinished();

    return promise.future();
}